

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int g_read(lua_State *L,FILE *f,int first)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  lconv *plVar11;
  ushort **ppuVar12;
  int iVar13;
  uint hex;
  bool bVar14;
  char *local_2070;
  luaL_Buffer local_2050;
  
  iVar3 = lua_gettop(L);
  clearerr((FILE *)f);
  if (iVar3 == 1) {
    uVar4 = read_line(L,f,1);
    iVar13 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar3 + 0x13,"too many arguments");
    iVar3 = iVar3 + -2;
    iVar13 = first;
    do {
      iVar5 = lua_type(L,iVar13);
      if (iVar5 == 3) {
        sVar8 = luaL_checkinteger(L,iVar13);
        if (sVar8 == 0) {
          iVar5 = getc((FILE *)f);
          ungetc(iVar5,(FILE *)f);
          lua_pushstring(L,"");
          bVar14 = iVar5 == -1;
        }
        else {
          luaL_buffinit(L,&local_2050);
          pcVar9 = luaL_prepbuffsize(&local_2050,sVar8);
          sVar10 = fread(pcVar9,1,sVar8,(FILE *)f);
          local_2050.n = local_2050.n + sVar10;
          luaL_pushresult(&local_2050);
          bVar14 = sVar10 == 0;
        }
        uVar4 = (uint)!bVar14;
      }
      else {
        pcVar9 = luaL_checklstring(L,iVar13,(size_t *)0x0);
        bVar1 = pcVar9[*pcVar9 == '*'];
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            iVar5 = 0;
LAB_0013cd8f:
            uVar4 = read_line(L,f,iVar5);
          }
          else {
            if (bVar1 != 0x61) {
LAB_0013ceff:
              iVar3 = luaL_argerror(L,iVar13,"invalid format");
              return iVar3;
            }
            luaL_buffinit(L,&local_2050);
            do {
              pcVar9 = luaL_prepbuffsize(&local_2050,0x2000);
              sVar10 = fread(pcVar9,1,0x2000,(FILE *)f);
              local_2050.n = local_2050.n + sVar10;
            } while (sVar10 == 0x2000);
            luaL_pushresult(&local_2050);
            uVar4 = 1;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            iVar5 = 1;
            goto LAB_0013cd8f;
          }
          if (bVar1 != 0x6e) goto LAB_0013ceff;
          local_2050.size._4_4_ = 0;
          local_2050.b = (char *)f;
          plVar11 = localeconv();
          cVar2 = *plVar11->decimal_point;
          flockfile((FILE *)f);
          do {
            uVar4 = getc_unlocked((FILE *)f);
            ppuVar12 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar12 + (long)(int)uVar4 * 2 + 1) & 0x20) != 0);
          local_2050.size._0_4_ = uVar4;
          if ((uVar4 == 0x2d) || (uVar4 == 0x2b)) {
            nextc((RN *)&local_2050);
          }
          if ((uint)local_2050.size == 0x30) {
            iVar5 = nextc((RN *)&local_2050);
            if (iVar5 == 0) {
              uVar4 = 0;
              goto LAB_0013cdb9;
            }
            if (((uint)local_2050.size | 0x20) != 0x78) {
              uVar4 = 1;
              goto LAB_0013cdb9;
            }
            uVar6 = nextc((RN *)&local_2050);
            uVar4 = uVar6 ^ 1;
            local_2070 = "eE";
            hex = (uint)(uVar6 != 0);
            if (uVar6 != 0) {
              local_2070 = "pP";
            }
          }
          else {
            uVar4 = 0;
LAB_0013cdb9:
            hex = 0;
            local_2070 = "eE";
          }
          iVar5 = readdigits((RN *)&local_2050,hex);
          iVar5 = iVar5 + uVar4;
          if (((uint)local_2050.size == (int)cVar2 || (uint)local_2050.size == 0x2e) &&
             (iVar7 = nextc((RN *)&local_2050), iVar7 != 0)) {
            iVar7 = readdigits((RN *)&local_2050,hex);
            iVar5 = iVar5 + iVar7;
          }
          if ((0 < iVar5) &&
             ((((uint)local_2050.size == (int)*local_2070 ||
               ((uint)local_2050.size == (int)local_2070[1])) &&
              (iVar5 = nextc((RN *)&local_2050), iVar5 != 0)))) {
            if (((uint)local_2050.size == 0x2d) || ((uint)local_2050.size == 0x2b)) {
              nextc((RN *)&local_2050);
            }
            readdigits((RN *)&local_2050,0);
          }
          pcVar9 = local_2050.b;
          ungetc((uint)local_2050.size,(FILE *)local_2050.b);
          funlockfile((FILE *)pcVar9);
          local_2050.initb[(long)local_2050.size._4_4_ + -0x10] = '\0';
          sVar8 = lua_stringtonumber(L,(char *)&local_2050.n);
          uVar4 = 1;
          if (sVar8 == 0) {
            lua_pushnil(L);
            uVar4 = 0;
          }
        }
      }
      iVar13 = iVar13 + 1;
      bVar14 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((bVar14) && (uVar4 != 0));
  }
  iVar3 = ferror((FILE *)f);
  if (iVar3 == 0) {
    if (uVar4 == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    iVar13 = iVar13 - first;
  }
  else {
    iVar13 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar13;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int success;
  int n;
  clearerr(f);
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first+1;  /* to return 1 result */
  }
  else {  /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    lua_pushnil(L);  /* push nil instead */
  }
  return n - first;
}